

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::addIfNoDWARFIssues(PassRunner *this,string *passName)

{
  char cVar1;
  bool bVar2;
  string local_48 [32];
  long *local_28;
  long *local_20;
  
  std::__cxx11::string::string(local_48,(string *)passName);
  PassRegistry::createPass((PassRegistry *)&local_20,(string *)singleton);
  std::__cxx11::string::~string(local_48);
  cVar1 = (**(code **)(*local_20 + 0x38))();
  if (cVar1 != '\0') {
    bVar2 = shouldPreserveDWARF(this);
    if (bVar2) goto LAB_00953c57;
  }
  local_28 = local_20;
  local_20 = (long *)0x0;
  (*this->_vptr_PassRunner[2])(this);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  local_28 = (long *)0x0;
LAB_00953c57:
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  return;
}

Assistant:

void PassRunner::addIfNoDWARFIssues(std::string passName) {
  auto pass = PassRegistry::get()->createPass(passName);
  if (!pass->invalidatesDWARF() || !shouldPreserveDWARF()) {
    doAdd(std::move(pass));
  }
}